

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O1

void r_object_collection(xr_packet *packet)

{
  undefined8 in_RAX;
  unsigned_short value;
  unsigned_short value_1;
  unsigned_short value_2;
  unsigned_short value_3;
  undefined8 local_18;
  
  local_18 = in_RAX;
  xray_re::xr_packet::r_raw(packet,&local_18,2);
  if ((short)local_18 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x18,"void r_object_collection(xr_packet &)");
  }
  xray_re::xr_packet::r_raw(packet,(void *)((long)&local_18 + 2),2);
  if (local_18._2_2_ != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x1a,"void r_object_collection(xr_packet &)");
  }
  xray_re::xr_packet::r_raw(packet,(void *)((long)&local_18 + 4),2);
  if (local_18._4_2_ != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x1c,"void r_object_collection(xr_packet &)");
  }
  xray_re::xr_packet::r_raw(packet,(void *)((long)&local_18 + 6),2);
  if (local_18._6_2_ == 0) {
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                ,0x1e,"void r_object_collection(xr_packet &)");
}

Assistant:

static void r_object_collection(xr_packet& packet)
{
	if (packet.r_u16())		// m_count
		xr_not_implemented();
	if (packet.r_u16())		// m_last_id
		xr_not_implemented();
	if (packet.r_u16())		// m_free
		xr_not_implemented();
	if (packet.r_u16())		// m_given
		xr_not_implemented();
}